

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool SetPropertyCommand::HandleAndValidateTestDirectoryScopes
               (cmExecutionStatus *status,bool test_directory_option_enabled,string *test_directory,
               cmMakefile **test_directory_makefile)

{
  bool bVar1;
  bool scope_options_valid;
  cmMakefile **test_directory_makefile_local;
  string *test_directory_local;
  bool test_directory_option_enabled_local;
  cmExecutionStatus *status_local;
  
  bVar1 = HandleTestDirectoryScopeValidation(status,test_directory_option_enabled,test_directory);
  if (bVar1) {
    status_local._7_1_ = HandleTestDirectoryScopes(status,test_directory,test_directory_makefile);
  }
  else {
    status_local._7_1_ = false;
  }
  return status_local._7_1_;
}

Assistant:

bool HandleAndValidateTestDirectoryScopes(cmExecutionStatus& status,
                                          bool test_directory_option_enabled,
                                          std::string& test_directory,
                                          cmMakefile*& test_directory_makefile)
{
  bool scope_options_valid =
    SetPropertyCommand::HandleTestDirectoryScopeValidation(
      status, test_directory_option_enabled, test_directory);
  if (!scope_options_valid) {
    return false;
  }

  scope_options_valid = SetPropertyCommand::HandleTestDirectoryScopes(
    status, test_directory, test_directory_makefile);
  return scope_options_valid;
}